

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanahijo.h
# Opt level: O0

void __thiscall TanahIjo::TanahIjo(TanahIjo *this)

{
  Point<double> local_80;
  Point<double> local_68;
  Point<double> local_50;
  Point<double> local_28;
  TanahIjo *local_10;
  TanahIjo *this_local;
  
  local_10 = this;
  Polygon::Polygon(&this->super_Polygon);
  Point<double>::Point(&local_28,0.0,500.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_50,0.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_68,800.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_80,800.0,500.0,0.0);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

TanahIjo() {
    addPoint(Point<double>(0,500));
    addPoint(Point<double>(0,600));
    addPoint(Point<double>(800,600));
    addPoint(Point<double>(800,500));
  }